

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_implement(lys_module *mod,char **features,lys_glob_unres *unres)

{
  lys_module *plVar1;
  char *local_70;
  char *local_60;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lys_module *m;
  LY_ERR r;
  lys_glob_unres *unres_local;
  char **features_local;
  lys_module *mod_local;
  
  if (mod->implemented != '\0') {
    __assert_fail("!mod->implemented",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x771,
                  "LY_ERR lys_implement(struct lys_module *, const char **, struct lys_glob_unres *)"
                 );
  }
  plVar1 = ly_ctx_get_module_implemented(mod->ctx,mod->name);
  if (plVar1 == (lys_module *)0x0) {
    mod_local._4_4_ = lys_set_features(mod->parsed,features);
    if ((mod_local._4_4_ == LY_SUCCESS) || (mod_local._4_4_ == LY_EEXIST)) {
      mod->implemented = '\x01';
      mod->to_compile = '\x01';
      mod_local._4_4_ = ly_set_add(&unres->implementing,mod,'\x01',(uint32_t *)0x0);
      if ((mod_local._4_4_ == LY_SUCCESS) &&
         ((mod_local._4_4_ = lys_precompile_augments_deviations(mod,unres),
          mod_local._4_4_ == LY_SUCCESS &&
          (mod_local._4_4_ = lys_has_compiled_import_r(mod), mod_local._4_4_ == LY_SUCCESS)))) {
        mod_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  else {
    if (plVar1 == mod) {
      __assert_fail("m != mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0x776,
                    "LY_ERR lys_implement(struct lys_module *, const char **, struct lys_glob_unres *)"
                   );
    }
    if (mod->revision == (char *)0x0) {
      local_60 = "<none>";
    }
    else {
      local_60 = mod->revision;
    }
    if (plVar1->revision == (char *)0x0) {
      local_70 = "<none>";
    }
    else {
      local_70 = plVar1->revision;
    }
    ly_log(mod->ctx,LY_LLERR,LY_EDENIED,
           "Module \"%s@%s\" is already implemented in revision \"%s\".",mod->name,local_60,local_70
          );
    mod_local._4_4_ = LY_EDENIED;
  }
  return mod_local._4_4_;
}

Assistant:

LY_ERR
lys_implement(struct lys_module *mod, const char **features, struct lys_glob_unres *unres)
{
    LY_ERR r;
    struct lys_module *m;

    assert(!mod->implemented);

    /* check collision with other implemented revision */
    m = ly_ctx_get_module_implemented(mod->ctx, mod->name);
    if (m) {
        assert(m != mod);
        LOGERR(mod->ctx, LY_EDENIED, "Module \"%s@%s\" is already implemented in revision \"%s\".",
                mod->name, mod->revision ? mod->revision : "<none>", m->revision ? m->revision : "<none>");
        return LY_EDENIED;
    }

    /* set features */
    r = lys_set_features(mod->parsed, features);
    if (r && (r != LY_EEXIST)) {
        return r;
    }

    /*
     * mark the module implemented, which means
     * 1) to (re)compile it only ::lys_compile() call is needed
     * 2) its compilation will never cause new modules to be implemented (::lys_compile() does not return ::LY_ERECOMPILE)
     *    but there can be some unres items added that do
     */
    mod->implemented = 1;

    /* this module is compiled in this compilation */
    mod->to_compile = 1;

    /* add the module into newly implemented module set */
    LY_CHECK_RET(ly_set_add(&unres->implementing, mod, 1, NULL));

    /* mark target modules with our augments and deviations */
    LY_CHECK_RET(lys_precompile_augments_deviations(mod, unres));

    /* check whether this module may reference any modules compiled previously */
    LY_CHECK_RET(lys_has_compiled_import_r(mod));

    return LY_SUCCESS;
}